

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

uint16_t * icu_63::getGroup(UCharNames *names,uint32_t code)

{
  uint uVar1;
  ushort *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar2 = (ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset);
  uVar1 = (uint)*puVar2;
  uVar3 = 0;
  while (uVar4 = uVar1, (int)uVar3 < (int)(uVar4 - 1)) {
    uVar5 = uVar4 + uVar3 >> 1;
    uVar1 = uVar5;
    if ((uint)*(ushort *)((long)puVar2 + (ulong)(uVar5 * 6) + 2) <= (code >> 5 & 0xffff)) {
      uVar1 = uVar4;
      uVar3 = uVar5;
    }
  }
  return (uint16_t *)((long)puVar2 + (ulong)(uVar3 * 6) + 2);
}

Assistant:

static const uint16_t *
getGroup(UCharNames *names, uint32_t code) {
    const uint16_t *groups=GET_GROUPS(names);
    uint16_t groupMSB=(uint16_t)(code>>GROUP_SHIFT),
             start=0,
             limit=*groups++,
             number;

    /* binary search for the group of names that contains the one for code */
    while(start<limit-1) {
        number=(uint16_t)((start+limit)/2);
        if(groupMSB<groups[number*GROUP_LENGTH+GROUP_MSB]) {
            limit=number;
        } else {
            start=number;
        }
    }

    /* return this regardless of whether it is an exact match */
    return groups+start*GROUP_LENGTH;
}